

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O2

int32_t uloc_setKeywordValue_63
                  (char *keywordName,char *keywordValue,char *buffer,int32_t bufferCapacity,
                  UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  char cVar3;
  int32_t sLength;
  uint uVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  char *__dest;
  char *__s;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  int32_t iVar11;
  long lVar12;
  int sLength_00;
  ulong uVar13;
  int sLength_01;
  char local_151;
  CharString updatedKeysAndValues;
  char keywordNameBuffer [25];
  char localeKeywordNameBuffer [25];
  char keywordValueBuffer [97];
  
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&updatedKeysAndValues.buffer);
  updatedKeysAndValues.len = 0;
  *updatedKeysAndValues.buffer.ptr = '\0';
  if (U_ZERO_ERROR < *status) {
    iVar11 = -1;
    goto LAB_0029dd75;
  }
  if (((keywordName != (char *)0x0) && (1 < bufferCapacity)) && (*keywordName != '\0')) {
    sVar7 = strlen(buffer);
    iVar6 = (int)sVar7;
    if (iVar6 <= bufferCapacity) {
      sLength = locale_canonKeywordName(keywordNameBuffer,keywordName,status);
      iVar11 = 0;
      if (U_ZERO_ERROR < *status) goto LAB_0029dd75;
      uVar13 = 0;
      if (keywordValue != (char *)0x0) {
        for (; keywordValue[uVar13] != '\0'; uVar13 = uVar13 + 1) {
          UVar2 = uprv_isASCIILetter_63(keywordValue[uVar13]);
          if (((UVar2 == '\0') && (9 < (byte)(keywordValue[uVar13] - 0x30U))) &&
             ((uVar4 = (byte)keywordValue[uVar13] - 0x2b, 0x34 < uVar4 ||
              ((0x10000000000015U >> ((ulong)uVar4 & 0x3f) & 1) == 0)))) goto LAB_0029dd6c;
          if (uVar13 == 0x60) goto LAB_0029e145;
          keywordValueBuffer[uVar13] = keywordValue[uVar13];
        }
      }
      sLength_00 = (int)uVar13;
      keywordValueBuffer[uVar13 & 0xffffffff] = '\0';
      __dest = locale_getKeywordsStart_63(buffer);
      iVar11 = iVar6;
      if ((__dest == (char *)0x0) || (__dest[1] == '\0')) {
        if (sLength_00 == 0) goto LAB_0029dd75;
        iVar11 = iVar6 + sLength + sLength_00 + (uint)(__dest == (char *)0x0) + 1;
        if (iVar11 < bufferCapacity) {
          pcVar8 = buffer + iVar6;
          if (__dest != (char *)0x0) {
            pcVar8 = __dest;
          }
          *pcVar8 = '@';
          strcpy(pcVar8 + 1,keywordNameBuffer);
          pcVar8[(long)sLength + 1] = '=';
          strcpy(pcVar8 + (long)sLength + 2,keywordValueBuffer);
          goto LAB_0029dd75;
        }
      }
      else {
        local_151 = '@';
        bVar1 = false;
        pcVar8 = __dest;
        while (pcVar8 != (char *)0x0) {
          __s = strchr(pcVar8 + 1,0x3d);
          if (__s == (char *)0x0) goto LAB_0029dd6c;
          do {
            pcVar9 = pcVar8 + 1;
            pcVar8 = pcVar8 + 1;
            pcVar10 = __s;
          } while (*pcVar9 == ' ');
          do {
            pcVar9 = pcVar10;
            if (pcVar9 <= pcVar8) break;
            pcVar10 = pcVar9 + -1;
          } while (pcVar9[-1] == ' ');
          if (pcVar9 == pcVar8) goto LAB_0029dd6c;
          for (lVar12 = 0; pcVar8 + lVar12 < pcVar9; lVar12 = lVar12 + 1) {
            UVar2 = uprv_isASCIILetter_63(pcVar8[lVar12]);
            if ((UVar2 == '\0') && (9 < (byte)(pcVar8[lVar12] - 0x30U))) goto LAB_0029dd6c;
            if (lVar12 == 0x18) goto LAB_0029e145;
            cVar3 = uprv_asciitolower_63(pcVar8[lVar12]);
            localeKeywordNameBuffer[lVar12] = cVar3;
          }
          localeKeywordNameBuffer[lVar12] = '\0';
          pcVar8 = strchr(__s,0x3b);
          uVar4 = ~(uint)__s;
          do {
            uVar5 = uVar4;
            pcVar9 = __s + 1;
            __s = __s + 1;
            uVar4 = uVar5 - 1;
          } while (*pcVar9 == ' ');
          pcVar9 = pcVar8;
          if (pcVar8 == (char *)0x0) {
            sVar7 = strlen(__s);
            pcVar9 = __s + sVar7;
          }
          iVar6 = uVar5 + (int)pcVar9;
          do {
            sLength_01 = iVar6;
            pcVar10 = pcVar9;
            if (pcVar10 <= __s) break;
            pcVar9 = pcVar10 + -1;
            iVar6 = sLength_01 + -1;
          } while (pcVar10[-1] == ' ');
          if (pcVar10 == __s) goto LAB_0029dd6c;
          iVar6 = strcmp(keywordNameBuffer,localeKeywordNameBuffer);
          if (iVar6 == 0) {
            bVar1 = true;
            if (sLength_00 != 0) {
              icu_63::CharString::append(&updatedKeysAndValues,local_151,status);
              icu_63::CharString::append(&updatedKeysAndValues,keywordNameBuffer,sLength,status);
              icu_63::CharString::append(&updatedKeysAndValues,'=',status);
              local_151 = ';';
              icu_63::CharString::append(&updatedKeysAndValues,keywordValueBuffer,sLength_00,status)
              ;
            }
          }
          else {
            if ((!bVar1 && sLength_00 != 0) && iVar6 < 0) {
              icu_63::CharString::append(&updatedKeysAndValues,local_151,status);
              icu_63::CharString::append(&updatedKeysAndValues,keywordNameBuffer,sLength,status);
              icu_63::CharString::append(&updatedKeysAndValues,'=',status);
              icu_63::CharString::append(&updatedKeysAndValues,keywordValueBuffer,sLength_00,status)
              ;
              local_151 = ';';
              bVar1 = true;
            }
            icu_63::CharString::append(&updatedKeysAndValues,local_151,status);
            icu_63::CharString::append
                      (&updatedKeysAndValues,localeKeywordNameBuffer,(int32_t)lVar12,status);
            icu_63::CharString::append(&updatedKeysAndValues,'=',status);
            local_151 = ';';
            icu_63::CharString::append(&updatedKeysAndValues,__s,sLength_01,status);
          }
          if ((pcVar8 == (char *)0x0 && sLength_00 != 0) && !bVar1) {
            icu_63::CharString::append(&updatedKeysAndValues,local_151,status);
            icu_63::CharString::append(&updatedKeysAndValues,keywordNameBuffer,sLength,status);
            icu_63::CharString::append(&updatedKeysAndValues,'=',status);
            bVar1 = true;
            icu_63::CharString::append(&updatedKeysAndValues,keywordValueBuffer,sLength_00,status);
          }
        }
        if ((!bVar1) || (U_ZERO_ERROR < *status)) goto LAB_0029dd75;
        iVar11 = ((int)__dest - (int)buffer) + updatedKeysAndValues.len;
        if (iVar11 < bufferCapacity) {
          if (0 < updatedKeysAndValues.len) {
            strncpy(__dest,updatedKeysAndValues.buffer.ptr,(ulong)(uint)updatedKeysAndValues.len);
          }
          buffer[iVar11] = '\0';
          goto LAB_0029dd75;
        }
      }
      *status = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_0029dd75;
    }
  }
LAB_0029dd6c:
  *status = U_ILLEGAL_ARGUMENT_ERROR;
  goto LAB_0029dd73;
LAB_0029e145:
  *status = U_INTERNAL_PROGRAM_ERROR;
LAB_0029dd73:
  iVar11 = 0;
LAB_0029dd75:
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&updatedKeysAndValues.buffer);
  return iVar11;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_setKeywordValue(const char* keywordName,
                     const char* keywordValue,
                     char* buffer, int32_t bufferCapacity,
                     UErrorCode* status)
{
    /* TODO: sorting. removal. */
    int32_t keywordNameLen;
    int32_t keywordValueLen;
    int32_t bufLen;
    int32_t needLen = 0;
    char keywordNameBuffer[ULOC_KEYWORD_BUFFER_LEN];
    char keywordValueBuffer[ULOC_KEYWORDS_CAPACITY+1];
    char localeKeywordNameBuffer[ULOC_KEYWORD_BUFFER_LEN];
    int32_t rc;
    char* nextSeparator = NULL;
    char* nextEqualsign = NULL;
    char* startSearchHere = NULL;
    char* keywordStart = NULL;
    CharString updatedKeysAndValues;
    int32_t updatedKeysAndValuesLen;
    UBool handledInputKeyAndValue = FALSE;
    char keyValuePrefix = '@';

    if(U_FAILURE(*status)) {
        return -1;
    }
    if (keywordName == NULL || keywordName[0] == 0 || bufferCapacity <= 1) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    bufLen = (int32_t)uprv_strlen(buffer);
    if(bufferCapacity<bufLen) {
        /* The capacity is less than the length?! Is this NULL terminated? */
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    keywordNameLen = locale_canonKeywordName(keywordNameBuffer, keywordName, status);
    if(U_FAILURE(*status)) {
        return 0;
    }

    keywordValueLen = 0;
    if(keywordValue) {
        while (*keywordValue != 0) {
            if (!UPRV_ISALPHANUM(*keywordValue) && !UPRV_OK_VALUE_PUNCTUATION(*keywordValue)) {
                *status = U_ILLEGAL_ARGUMENT_ERROR; /* malformed key value */
                return 0;
            }
            if (keywordValueLen < ULOC_KEYWORDS_CAPACITY) {
                /* Should we force lowercase in value to set? */
                keywordValueBuffer[keywordValueLen++] = *keywordValue++;
            } else {
                /* keywordValue too long for internal buffer */
                *status = U_INTERNAL_PROGRAM_ERROR;
                return 0;
            }
        }
    }
    keywordValueBuffer[keywordValueLen] = 0; /* terminate */

    startSearchHere = (char*)locale_getKeywordsStart(buffer);
    if(startSearchHere == NULL || (startSearchHere[1]==0)) {
        if(keywordValueLen == 0) { /* no keywords = nothing to remove */
            return bufLen;
        }

        needLen = bufLen+1+keywordNameLen+1+keywordValueLen;
        if(startSearchHere) { /* had a single @ */
            needLen--; /* already had the @ */
            /* startSearchHere points at the @ */
        } else {
            startSearchHere=buffer+bufLen;
        }
        if(needLen >= bufferCapacity) {
            *status = U_BUFFER_OVERFLOW_ERROR;
            return needLen; /* no change */
        }
        *startSearchHere++ = '@';
        uprv_strcpy(startSearchHere, keywordNameBuffer);
        startSearchHere += keywordNameLen;
        *startSearchHere++ = '=';
        uprv_strcpy(startSearchHere, keywordValueBuffer);
        return needLen;
    } /* end shortcut - no @ */

    keywordStart = startSearchHere;
    /* search for keyword */
    while(keywordStart) {
        const char* keyValueTail;
        int32_t keyValueLen;

        keywordStart++; /* skip @ or ; */
        nextEqualsign = uprv_strchr(keywordStart, '=');
        if (!nextEqualsign) {
            *status = U_ILLEGAL_ARGUMENT_ERROR; /* key must have =value */
            return 0;
        }
        /* strip leading & trailing spaces (TC decided to tolerate these) */
        while(*keywordStart == ' ') {
            keywordStart++;
        }
        keyValueTail = nextEqualsign;
        while (keyValueTail > keywordStart && *(keyValueTail-1) == ' ') {
            keyValueTail--;
        }
        /* now keyValueTail points to first char after the keyName */
        /* copy & normalize keyName from locale */
        if (keywordStart == keyValueTail) {
            *status = U_ILLEGAL_ARGUMENT_ERROR; /* empty keyword name in passed-in locale */
            return 0;
        }
        keyValueLen = 0;
        while (keywordStart < keyValueTail) {
            if (!UPRV_ISALPHANUM(*keywordStart)) {
                *status = U_ILLEGAL_ARGUMENT_ERROR; /* malformed keyword name */
                return 0;
            }
            if (keyValueLen < ULOC_KEYWORD_BUFFER_LEN - 1) {
                localeKeywordNameBuffer[keyValueLen++] = uprv_tolower(*keywordStart++);
            } else {
                /* keyword name too long for internal buffer */
                *status = U_INTERNAL_PROGRAM_ERROR;
                return 0;
            }
        }
        localeKeywordNameBuffer[keyValueLen] = 0; /* terminate */

        nextSeparator = uprv_strchr(nextEqualsign, ';');

        /* start processing the value part */
        nextEqualsign++; /* skip '=' */
        /* First strip leading & trailing spaces (TC decided to tolerate these) */
        while(*nextEqualsign == ' ') {
            nextEqualsign++;
        }
        keyValueTail = (nextSeparator)? nextSeparator: nextEqualsign + uprv_strlen(nextEqualsign);
        while(keyValueTail > nextEqualsign && *(keyValueTail-1) == ' ') {
            keyValueTail--;
        }
        if (nextEqualsign == keyValueTail) {
            *status = U_ILLEGAL_ARGUMENT_ERROR; /* empty key value in passed-in locale */
            return 0;
        }

        rc = uprv_strcmp(keywordNameBuffer, localeKeywordNameBuffer);
        if(rc == 0) {
            /* Current entry matches the input keyword. Update the entry */
            if(keywordValueLen > 0) { /* updating a value */
                updatedKeysAndValues.append(keyValuePrefix, *status);
                keyValuePrefix = ';'; /* for any subsequent key-value pair */
                updatedKeysAndValues.append(keywordNameBuffer, keywordNameLen, *status);
                updatedKeysAndValues.append('=', *status);
                updatedKeysAndValues.append(keywordValueBuffer, keywordValueLen, *status);
            } /* else removing this entry, don't emit anything */
            handledInputKeyAndValue = TRUE;
        } else {
           /* input keyword sorts earlier than current entry, add before current entry */
            if (rc < 0 && keywordValueLen > 0 && !handledInputKeyAndValue) {
                /* insert new entry at this location */
                updatedKeysAndValues.append(keyValuePrefix, *status);
                keyValuePrefix = ';'; /* for any subsequent key-value pair */
                updatedKeysAndValues.append(keywordNameBuffer, keywordNameLen, *status);
                updatedKeysAndValues.append('=', *status);
                updatedKeysAndValues.append(keywordValueBuffer, keywordValueLen, *status);
                handledInputKeyAndValue = TRUE;
            }
            /* copy the current entry */
            updatedKeysAndValues.append(keyValuePrefix, *status);
            keyValuePrefix = ';'; /* for any subsequent key-value pair */
            updatedKeysAndValues.append(localeKeywordNameBuffer, keyValueLen, *status);
            updatedKeysAndValues.append('=', *status);
            updatedKeysAndValues.append(nextEqualsign, static_cast<int32_t>(keyValueTail-nextEqualsign), *status);
        }
        if (!nextSeparator && keywordValueLen > 0 && !handledInputKeyAndValue) {
            /* append new entry at the end, it sorts later than existing entries */
            updatedKeysAndValues.append(keyValuePrefix, *status);
            /* skip keyValuePrefix update, no subsequent key-value pair */
            updatedKeysAndValues.append(keywordNameBuffer, keywordNameLen, *status);
            updatedKeysAndValues.append('=', *status);
            updatedKeysAndValues.append(keywordValueBuffer, keywordValueLen, *status);
            handledInputKeyAndValue = TRUE;
        }
        keywordStart = nextSeparator;
    } /* end loop searching */

    /* Any error from updatedKeysAndValues.append above would be internal and not due to
     * problems with the passed-in locale. So if we did encounter problems with the
     * passed-in locale above, those errors took precedence and overrode any error
     * status from updatedKeysAndValues.append, and also caused a return of 0. If there
     * are errors here they are from updatedKeysAndValues.append; they do cause an
     * error return but the passed-in locale is unmodified and the original bufLen is
     * returned.
     */
    if (!handledInputKeyAndValue || U_FAILURE(*status)) {
        /* if input key/value specified removal of a keyword not present in locale, or
         * there was an error in CharString.append, leave original locale alone. */
        return bufLen;
    }

    updatedKeysAndValuesLen = updatedKeysAndValues.length();
    /* needLen = length of the part before '@' + length of updated key-value part including '@' */
    needLen = (int32_t)(startSearchHere - buffer) + updatedKeysAndValuesLen;
    if(needLen >= bufferCapacity) {
        *status = U_BUFFER_OVERFLOW_ERROR;
        return needLen; /* no change */
    }
    if (updatedKeysAndValuesLen > 0) {
        uprv_strncpy(startSearchHere, updatedKeysAndValues.data(), updatedKeysAndValuesLen);
    }
    buffer[needLen]=0;
    return needLen;
}